

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O0

char * Vec_StrPrintF(Vec_Str_t *p,char *format,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined4 local_38;
  undefined4 local_34;
  va_list args;
  int nSize;
  int nAdded;
  char *format_local;
  Vec_Str_t *p_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  args[0].reg_save_area._0_4_ = 1000;
  args[0].overflow_arg_area = local_e8;
  args[0]._0_8_ = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x10;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar1 = Vec_StrSize(p);
  Vec_StrGrow(p,iVar1 + (int)args[0].reg_save_area);
  pcVar2 = Vec_StrLimit(p);
  args[0].reg_save_area._4_4_ = vsnprintf(pcVar2,(long)(int)args[0].reg_save_area,format,&local_38);
  if ((int)args[0].reg_save_area < args[0].reg_save_area._4_4_) {
    iVar1 = Vec_StrSize(p);
    Vec_StrGrow(p,iVar1 + args[0].reg_save_area._4_4_ + (int)args[0].reg_save_area);
    pcVar2 = Vec_StrLimit(p);
    args[0].reg_save_area._0_4_ =
         vsnprintf(pcVar2,(long)args[0].reg_save_area._4_4_,format,&local_38);
    if ((int)args[0].reg_save_area != args[0].reg_save_area._4_4_) {
      __assert_fail("nSize == nAdded",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                    ,0x2c1,"char *Vec_StrPrintF(Vec_Str_t *, const char *, ...)");
    }
  }
  p->nSize = p->nSize + args[0].reg_save_area._4_4_;
  pcVar2 = Vec_StrLimit(p);
  return pcVar2 + -(long)args[0].reg_save_area._4_4_;
}

Assistant:

static inline char * Vec_StrPrintF( Vec_Str_t * p, const char * format, ... )
{
    int nAdded, nSize = 1000; 
    va_list args;  va_start( args, format );
    Vec_StrGrow( p, Vec_StrSize(p) + nSize );
    nAdded = vsnprintf( Vec_StrLimit(p), nSize, format, args );
    if ( nAdded > nSize )
    {
        Vec_StrGrow( p, Vec_StrSize(p) + nAdded + nSize );
        nSize = vsnprintf( Vec_StrLimit(p), nAdded, format, args );
        assert( nSize == nAdded );
    }
    p->nSize += nAdded;
    va_end( args );
    return Vec_StrLimit(p) - nAdded;
}